

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O0

bool __thiscall
sliding_puzzle::SlidingPuzzle::generateSuccessorForAction
          (SlidingPuzzle *this,SlidingPuzzleStatePtr *current_state,int *anchor_location,char action
          ,SlidingPuzzleState *successor_state)

{
  value_type vVar1;
  code *pcVar2;
  element_type *peVar3;
  reference pvVar4;
  reference pvVar5;
  SlidingPuzzleState *successor_state_local;
  char action_local;
  int *anchor_location_local;
  SlidingPuzzleStatePtr *current_state_local;
  SlidingPuzzle *this_local;
  
  switch(action) {
  case 'E':
    if (anchor_location[1] == puzzle_size + -1) {
      this_local._7_1_ = false;
    }
    else {
      peVar3 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)current_state);
      SlidingPuzzleState::operator=(successor_state,peVar3);
      peVar3 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)current_state);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar3->state_,(long)*anchor_location);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)anchor_location[1]);
      vVar1 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&successor_state->state_,(long)*anchor_location);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (pvVar4,(long)(anchor_location[1] + 1));
      *pvVar5 = vVar1;
      peVar3 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)current_state);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar3->state_,(long)*anchor_location);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (pvVar4,(long)(anchor_location[1] + 1));
      vVar1 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&successor_state->state_,(long)*anchor_location);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)anchor_location[1]);
      *pvVar5 = vVar1;
      this_local._7_1_ = true;
    }
    break;
  default:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  case 'N':
    if (*anchor_location == 0) {
      this_local._7_1_ = false;
    }
    else {
      peVar3 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)current_state);
      SlidingPuzzleState::operator=(successor_state,peVar3);
      peVar3 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)current_state);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar3->state_,(long)*anchor_location);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)anchor_location[1]);
      vVar1 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&successor_state->state_,(long)(*anchor_location + -1));
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)anchor_location[1]);
      *pvVar5 = vVar1;
      peVar3 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)current_state);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar3->state_,(long)(*anchor_location + -1));
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)anchor_location[1]);
      vVar1 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&successor_state->state_,(long)*anchor_location);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)anchor_location[1]);
      *pvVar5 = vVar1;
      this_local._7_1_ = true;
    }
    break;
  case 'S':
    if (*anchor_location == puzzle_size + -1) {
      this_local._7_1_ = false;
    }
    else {
      peVar3 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)current_state);
      SlidingPuzzleState::operator=(successor_state,peVar3);
      peVar3 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)current_state);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar3->state_,(long)*anchor_location);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)anchor_location[1]);
      vVar1 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&successor_state->state_,(long)(*anchor_location + 1));
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)anchor_location[1]);
      *pvVar5 = vVar1;
      peVar3 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)current_state);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar3->state_,(long)(*anchor_location + 1));
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)anchor_location[1]);
      vVar1 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&successor_state->state_,(long)*anchor_location);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)anchor_location[1]);
      *pvVar5 = vVar1;
      this_local._7_1_ = true;
    }
    break;
  case 'W':
    if (anchor_location[1] == 0) {
      this_local._7_1_ = false;
    }
    else {
      peVar3 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)current_state);
      SlidingPuzzleState::operator=(successor_state,peVar3);
      peVar3 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)current_state);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar3->state_,(long)*anchor_location);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)anchor_location[1]);
      vVar1 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&successor_state->state_,(long)*anchor_location);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (pvVar4,(long)(anchor_location[1] + -1));
      *pvVar5 = vVar1;
      peVar3 = std::
               __shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)current_state);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&peVar3->state_,(long)*anchor_location);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (pvVar4,(long)(anchor_location[1] + -1));
      vVar1 = *pvVar5;
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&successor_state->state_,(long)*anchor_location);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)anchor_location[1]);
      *pvVar5 = vVar1;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool SlidingPuzzle::generateSuccessorForAction(const SlidingPuzzleStatePtr& current_state,
                                               const int* anchor_location,
                                               const char action,
                                               SlidingPuzzleState& successor_state)
{

  switch(action)
  {
    case 'N':
      if (anchor_location[0]==0)
      {
        return false;
      }
      else
      {
        successor_state = *current_state;
        successor_state.state_[anchor_location[0]-1][anchor_location[1]] =
                current_state->state_[anchor_location[0]][anchor_location[1]];
        successor_state.state_[anchor_location[0]][anchor_location[1]] =
                current_state->state_[anchor_location[0]-1][anchor_location[1]];
        return true;
      }
    case 'E':
      if (anchor_location[1]==puzzle_size-1)
      {
        return false;
      }
      else
      {
        successor_state = *current_state;
        successor_state.state_[anchor_location[0]][anchor_location[1]+1] =
                current_state->state_[anchor_location[0]][anchor_location[1]];
        successor_state.state_[anchor_location[0]][anchor_location[1]] =
                current_state->state_[anchor_location[0]][anchor_location[1]+1];
        return true;
      }
    case 'W':
      if (anchor_location[1]==0)
      {
        return false;
      }
      else
      {
        successor_state = *current_state;
        successor_state.state_[anchor_location[0]][anchor_location[1]-1] =
                current_state->state_[anchor_location[0]][anchor_location[1]];
        successor_state.state_[anchor_location[0]][anchor_location[1]] =
                current_state->state_[anchor_location[0]][anchor_location[1]-1];
        return true;
      }
    case 'S':
      if (anchor_location[0]==puzzle_size-1)
      {
        return false;
      }
      else
      {
        successor_state = *current_state;
        successor_state.state_[anchor_location[0]+1][anchor_location[1]] =
                current_state->state_[anchor_location[0]][anchor_location[1]];
        successor_state.state_[anchor_location[0]][anchor_location[1]] =
                current_state->state_[anchor_location[0]+1][anchor_location[1]];
        return true;
      }
  }
}